

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

tc_toktyp_t CTcTokenizer::tokenize_string(utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  byte bVar1;
  char *p_00;
  CTcToken *buf;
  bool bVar2;
  uint ch;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  tc_toktyp_t tVar6;
  CTcToken *pCVar7;
  tok_embed_level *ptVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  CTcToken *p_01;
  int triple;
  byte *pbVar13;
  utf8_ptr *p_02;
  tc_toktyp_t tVar14;
  wchar_t qu;
  CTcToken *pCVar15;
  bool bVar16;
  
  p_00 = p->p_;
  wVar3 = utf8_ptr::s_getch(p_00);
  pbVar13 = (byte *)p->p_;
  if (wVar3 == L'R') {
    pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3) + 1;
    p->p_ = (char *)pbVar13;
  }
  wVar4 = utf8_ptr::s_getch((char *)pbVar13);
  bVar1 = *p->p_;
  triple = 0;
  p_02 = (utf8_ptr *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
  p->p_ = (char *)p_02;
  if (((wVar4 == L'\'') || (wVar4 == L'\"')) &&
     (iVar5 = count_quotes(p_02,wVar4), triple = 0, 1 < iVar5)) {
    pbVar13 = (byte *)p->p_;
    uVar9 = (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3);
    p->p_ = (char *)(pbVar13 + uVar9 + 1);
    bVar1 = pbVar13[uVar9 + 1];
    p->p_ = (char *)(pbVar13 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar9 + 2);
    triple = 1;
  }
  qu = L'\"';
  if (wVar4 == L'\"') {
    bVar16 = ec != (tok_embed_ctx *)0x0;
    tVar14 = TOKT_DSTR;
    goto LAB_0021a184;
  }
  if (wVar4 != L'>') {
    bVar16 = false;
    if (wVar4 == L'\'') {
      bVar16 = ec != (tok_embed_ctx *)0x0;
      qu = L'\'';
      tVar14 = TOKT_SSTR;
    }
    else {
      tVar14 = TOKT_INVALID;
    }
    goto LAB_0021a184;
  }
  bVar16 = ec != (tok_embed_ctx *)0x0;
  if (ec == (tok_embed_ctx *)0x0) {
    qu = L'\"';
    tVar14 = TOKT_INVALID;
  }
  else {
    uVar12 = ec->level;
    if (uVar12 == 0) {
      qu = L'\0';
      tVar14 = TOKT_INVALID;
      triple = 0;
LAB_0021a150:
      ptVar8 = (tok_embed_level *)0x0;
    }
    else {
      ptVar8 = ec->s;
      tVar14 = ptVar8->endtok;
      qu = ptVar8->qu;
      triple = ptVar8->triple;
      if (0 < (int)uVar12) {
        uVar11 = uVar12 - 1;
        ec->level = uVar11;
        if (uVar11 == 0) goto LAB_0021a150;
        bVar2 = 10 < uVar12;
        uVar12 = uVar11;
        if (bVar2) goto LAB_0021a164;
      }
      ptVar8 = ec->stk + (long)(int)uVar12 + -1;
    }
    ec->s = ptVar8;
  }
LAB_0021a164:
  bVar1 = *p->p_;
  p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
LAB_0021a184:
  tVar6 = TOKT_RESTR;
  if (wVar3 != L'R') {
    tVar6 = tVar14;
  }
  buf = (CTcToken *)p->p_;
  pCVar7 = buf;
  pCVar15 = tok;
  do {
    wVar4 = utf8_ptr::s_getch((char *)pCVar7);
    if (wVar4 == L'\\') {
      bVar1 = *p->p_;
      p_01 = (CTcToken *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1)
      ;
      p->p_ = (char *)p_01;
      if (triple == 0) goto LAB_0021a2bf;
      wVar4 = utf8_ptr::s_getch((char *)p_01);
      p_01 = (CTcToken *)p->p_;
      if (wVar4 != qu) goto LAB_0021a2bf;
      while (wVar4 = utf8_ptr::s_getch((char *)p_01), p_01 = pCVar15, wVar4 == qu) {
        bVar1 = *p->p_;
        p_01 = (CTcToken *)
               (p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
        p->p_ = (char *)p_01;
      }
    }
    else {
      if ((wVar3 == L'R') || (!(bool)(wVar4 == L'<' & bVar16))) {
        if (wVar4 == qu) {
LAB_0021a25f:
          p_01 = (CTcToken *)p->p_;
          if (triple == 0) {
            pCVar7 = (CTcToken *)
                     ((long)&p_01->typ_ +
                     (ulong)(((*(byte *)&p_01->typ_ >> 5 & 1) != 0) + 1 &
                            (uint)(*(byte *)&p_01->typ_ >> 7) * 3) + 1);
            p->p_ = (char *)pCVar7;
          }
          else {
            iVar5 = count_quotes((utf8_ptr *)p_01,qu);
            if (iVar5 < 3) {
              p_01 = pCVar15;
              if (iVar5 != 0) {
                lVar10 = (long)iVar5;
                pbVar13 = (byte *)p->p_;
                do {
                  pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 &
                                             (uint)(*pbVar13 >> 7) * 3) + 1;
                  p->p_ = (char *)pbVar13;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
            }
            else {
              if (iVar5 - 3U == 0) {
                p_01 = (CTcToken *)p->p_;
              }
              else {
                uVar9 = (ulong)(iVar5 - 3U);
                p_01 = (CTcToken *)p->p_;
                do {
                  p_01 = (CTcToken *)
                         ((long)&p_01->typ_ +
                         (ulong)(((*(byte *)&p_01->typ_ >> 5 & 1) != 0) + 1 &
                                (uint)(*(byte *)&p_01->typ_ >> 7) * 3) + 1);
                  p->p_ = (char *)p_01;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              lVar10 = -3;
              pCVar7 = p_01;
              do {
                pCVar7 = (CTcToken *)
                         ((long)&pCVar7->typ_ +
                         (ulong)(((*(byte *)&pCVar7->typ_ >> 5 & 1) != 0) + 1 &
                                (uint)(*(byte *)&pCVar7->typ_ >> 7) * 3) + 1);
                p->p_ = (char *)pCVar7;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0);
            }
            if (iVar5 < 3) goto LAB_0021a34f;
            pCVar7 = (CTcToken *)p->p_;
          }
          goto LAB_0021a45d;
        }
        p_01 = (CTcToken *)p->p_;
        if (wVar4 == L'\0') {
          pCVar7 = p_01;
          if ((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) !=
              (undefined1  [3440])0x0) {
            log_error(0x272a);
            pCVar7 = (CTcToken *)p->p_;
          }
          goto LAB_0021a45d;
        }
      }
      else {
        wVar4 = utf8_ptr::s_getch_at(p->p_,1);
        if (wVar4 == L'<') {
          if (tVar14 == TOKT_SSTR) {
            tVar6 = TOKT_SSTR_START;
          }
          else if (tVar14 == TOKT_DSTR) {
            tVar6 = TOKT_DSTR_START;
          }
          else if (tVar14 == TOKT_DSTR_END) {
            tVar6 = TOKT_DSTR_MID;
          }
          else {
            tVar6 = TOKT_SSTR_MID;
            if (tVar14 != TOKT_SSTR_END) {
              tVar6 = tVar14;
            }
          }
          tok_embed_ctx::start_expr(ec,qu,triple,(uint)(expanding == 0));
          p_01 = (CTcToken *)p->p_;
          uVar9 = (ulong)(((*(byte *)&p_01->typ_ >> 5 & 1) != 0) + 1 &
                         (uint)(*(byte *)&p_01->typ_ >> 7) * 3);
          pbVar13 = (byte *)((long)&p_01->typ_ + uVar9 + 1);
          p->p_ = (char *)pbVar13;
          bVar1 = *pbVar13;
          pCVar7 = (CTcToken *)
                   ((long)&p_01->typ_ +
                   (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar9 + 2);
          p->p_ = (char *)pCVar7;
LAB_0021a45d:
          tok->text_ = p_00;
          tok->text_len_ = (long)pCVar7 - (long)p_00;
          if ((((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) ==
                (undefined1  [3440])0x0) && (G_tok->string_fp_ != (CVmDataSource *)0x0)) &&
             (buf != p_01)) {
            CCharmapToLocal::write_file
                      (G_tok->string_fp_map_,G_tok->string_fp_,(char *)buf,(long)p_01 - (long)buf);
            (*G_tok->string_fp_->_vptr_CVmDataSource[4])(G_tok->string_fp_,"\n",1);
          }
          tok->typ_ = tVar6;
          return tVar6;
        }
        if (qu == L'<') goto LAB_0021a25f;
        p_01 = (CTcToken *)p->p_;
      }
LAB_0021a2bf:
      p->p_ = (char *)((long)&p_01->typ_ +
                      (ulong)(((*(byte *)&p_01->typ_ >> 5 & 1) != 0) + 1 &
                             (uint)(*(byte *)&p_01->typ_ >> 7) * 3) + 1);
      p_01 = pCVar15;
    }
LAB_0021a34f:
    pCVar7 = (CTcToken *)p->p_;
    pCVar15 = p_01;
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::tokenize_string(
    utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec, int expanding)
{
    /* remember where the text starts */
    const char *start = p->getptr();

    /* check for a regex string - R'...' or R"..." */
    int regex = (p->getch() == 'R');
    if (regex)
        p->inc();

    /* note the quote type, for matching later */
    wchar_t qu = p->getch();

    /* skip the quote in the input */
    p->inc();

    /* check for triple quotes */
    int triple = FALSE;
    if ((qu == '"' || qu == '\'') && count_quotes(p, qu) >= 2)
    {
        /* note the triple quotes */
        triple = TRUE;

        /* skip the open quotes */
        p->inc();
        p->inc();
    }

    /* determine the token type based on the quote type */
    tc_toktyp_t typ;
    int allow_embedding;
    switch(qu)
    {
    case '\'':
        /* single-quoted string */
        typ = TOKT_SSTR;
        allow_embedding = (ec != 0);
        break;

    case '"':
        /* regular double-quoted string */
        typ = TOKT_DSTR;
        allow_embedding = (ec != 0);
        break;

    case '>':
        /* get the ending type for the embedding */
        if (ec != 0)
        {
            /* return to the enclosing string context */
            typ = ec->endtok();
            qu = ec->qu();
            triple = ec->triple();

            /* allow more embeddings */
            allow_embedding = TRUE;

            /* exit the expression context */
            ec->end_expr();
        }
        else
        {
            /* we can only finish an embedding if we were already in one */
            typ = TOKT_INVALID;
            qu = '"';
            allow_embedding = FALSE;
        }

        /* skip the extra '>' character */
        p->inc();
        break;

    default:
        /* anything else is invalid */
        typ = TOKT_INVALID;
        qu = '"';
        allow_embedding = FALSE;
        break;
    }

    /* if it's a regex string, it has special handling */
    if (regex)
    {
        /* embeddings aren't allowed in regex strings */
        allow_embedding = FALSE;

        /* the token type is 'regex string' */
        typ = TOKT_RESTR;
    }

    /* this is where the string's contents start */
    const char *contents_start = p->getptr();

    /* we don't know where it ends yet */
    const char *contents_end;

    /* scan the string */
    for (;;)
    {
        /* get the current character */
        wchar_t cur = p->getch();

        /* see what we have */
        if (cur == '\\')
        {
            /* escape sequence - skip an extra character */
            p->inc();

            /* 
             *   if we're in a triple-quoted string, and this matches the
             *   quote type, a single '\' escapes all consecutive quotes 
             */
            if (triple && p->getch() == qu)
            {
                /* skip the whole run of quotes */
                for ( ; p->getch() == qu ; p->inc()) ;

                /* take it from the top, as we've already skipped them all */
                continue;
            }
        }
        else if (cur == '<' && allow_embedding && p->getch_at(1) == '<')
        {
            /* 
             *   it's the start of an embedded expression - return the
             *   appropriate embedded string part type 
             */
            typ = (typ == TOKT_DSTR ? TOKT_DSTR_START :
                   typ == TOKT_DSTR_END ? TOKT_DSTR_MID :
                   typ == TOKT_SSTR ? TOKT_SSTR_START :
                   typ == TOKT_SSTR_END ? TOKT_SSTR_MID :
                   typ);

            /* remember that we're in an embedding in the token stream */
            ec->start_expr(qu, triple, !expanding);

            /* this is where the contents end */
            contents_end = p->getptr();

            /* skip the two embedding characters */
            p->inc();
            p->inc();

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);

            /* done */
            break;
        }
        else if (cur == qu)
        {
            /* 
             *   if we're in a triple-quoted string, it ends at a triple
             *   quote, except that any additional consecutive quotes go
             *   inside the string rather than outside 
             */
            if (triple)
            {
                /* we need at least three quotes in a row to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* the contents include any quotes before the last 3 */
                    p->inc_by(qcnt - 3);
                    contents_end = p->getptr();

                    /* skip the three close quotes */
                    p->inc_by(3);
                }
                else
                {
                    /* it's not ending; skip the quotes and carry on */
                    p->inc_by(qcnt);
                    continue;
                }
            }
            else
            {
                /* note where the string ends */
                contents_end = p->getptr();

                /* skip the closing quote */
                p->inc();
            }

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);
            
            /* done */
            break;
        }
        else if (cur == '\0')
        {
            /* this is where the contents end */
            contents_end = p->getptr();

            /* 
             *   We have an unterminated string.  If we're evaluating a
             *   preprocessor constant expression, log an error; otherwise
             *   let it go for now, since we'll catch the error during the
             *   normal tokenizing pass for parsing. 
             */
            if (G_tok->in_pp_expr_)
                log_error(TCERR_PP_UNTERM_STRING);

            /* set the partial text */
            tok->set_text(start, p->getptr() - start);
            
            /* end of line - return with the string unfinished */
            break;
        }

        /* skip this character of input */
        p->inc();
    }

    /* 
     *   if we're not in preprocessor mode, and we're saving string text,
     *   write the string to the string text output file 
     */
    if (!G_tok->in_pp_expr_ && G_tok->string_fp_ != 0
        && contents_start != contents_end)
    {
        /* write the line, translating back to the source character set */
        G_tok->string_fp_map_
            ->write_file(G_tok->string_fp_, contents_start,
                         (size_t)(contents_end - contents_start));

        /* add a newline */
        G_tok->string_fp_->write("\n", 1);
    }

    /* set the type in the token */
    tok->settyp(typ);

    /* return the token type */
    return tok->gettyp();
}